

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall rsg::TexLookup::evaluate(TexLookup *this,ExecutionContext *execCtx)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  float *pfVar2;
  float fVar3;
  ConstStridedValueAccess<64> local_350;
  int local_33c;
  undefined1 local_338 [4];
  int comp_5;
  Vec4 p_5;
  undefined1 auStack_310 [4];
  float l_2;
  float local_2fc;
  undefined1 auStack_2f8 [4];
  float r_1;
  float local_2e4;
  undefined1 auStack_2e0 [4];
  float t_5;
  float local_2d0;
  int local_2cc;
  float s_5;
  int i_5;
  SamplerCube *tex_5;
  ExecConstValueAccess lod_2;
  int local_29c;
  undefined1 local_298 [4];
  int comp_4;
  Vec4 p_4;
  undefined1 auStack_270 [4];
  float r;
  float local_25c;
  undefined1 auStack_258 [4];
  float t_4;
  float local_248;
  int local_244;
  float s_4;
  int i_4;
  SamplerCube *tex_4;
  int local_224;
  undefined1 local_220 [4];
  int comp_3;
  Vec4 p_3;
  undefined1 auStack_1f8 [4];
  float l_1;
  float local_1e4;
  undefined1 auStack_1e0 [4];
  float w_1;
  float local_1cc;
  undefined1 auStack_1c8 [4];
  float t_3;
  float local_1b8;
  int local_1b4;
  float s_3;
  int i_3;
  Sampler2D *tex_3;
  ExecConstValueAccess lod_1;
  int local_184;
  undefined1 local_180 [4];
  int comp_2;
  Vec4 p_2;
  undefined1 auStack_158 [4];
  float w;
  float local_144;
  undefined1 auStack_140 [4];
  float t_2;
  float local_130;
  int local_12c;
  float s_2;
  int i_2;
  Sampler2D *tex_2;
  int local_10c;
  undefined1 local_108 [4];
  int comp_1;
  Vec4 p_1;
  undefined1 auStack_e0 [4];
  float l;
  float local_cc;
  undefined1 auStack_c8 [4];
  float t_1;
  float local_b8;
  int local_b4;
  float s_1;
  int i_1;
  Sampler2D *tex_1;
  ExecConstValueAccess lod;
  int local_84;
  undefined1 local_80 [4];
  int comp;
  Vec4 p;
  undefined1 auStack_58 [4];
  float t;
  undefined4 local_48;
  int local_44;
  float s;
  int i;
  Sampler2D *tex;
  ExecValueAccess dst;
  ExecConstValueAccess coords;
  ExecutionContext *execCtx_local;
  TexLookup *this_local;
  
  (*this->m_coordExpr->_vptr_Expression[4])(this->m_coordExpr,execCtx);
  if (this->m_lodBiasExpr != (Expression *)0x0) {
    (*this->m_lodBiasExpr->_vptr_Expression[4])(this->m_lodBiasExpr,execCtx);
  }
  iVar1 = (*this->m_coordExpr->_vptr_Expression[5])();
  dst.super_ConstStridedValueAccess<64>.m_value = (Scalar *)CONCAT44(extraout_var,iVar1);
  _tex = (ConstStridedValueAccess<64>)ValueStorage<64>::getValue(&this->m_value,&this->m_valueType);
  switch(this->m_type) {
  case TYPE_TEXTURE2D:
    _s = ExecutionContext::getSampler2D(execCtx,this->m_sampler);
    for (local_44 = 0; local_44 < 0x40; local_44 = local_44 + 1) {
      _auStack_58 = ConstStridedValueAccess<64>::component
                              ((ConstStridedValueAccess<64> *)
                               &dst.super_ConstStridedValueAccess<64>.m_value,0);
      local_48 = ConstStridedValueAccess<64>::asFloat
                           ((ConstStridedValueAccess<64> *)auStack_58,local_44);
      join_0x00000010_0x00000000_ =
           ConstStridedValueAccess<64>::component
                     ((ConstStridedValueAccess<64> *)&dst.super_ConstStridedValueAccess<64>.m_value,
                      1);
      fVar3 = ConstStridedValueAccess<64>::asFloat
                        ((ConstStridedValueAccess<64> *)(p.m_data + 2),local_44);
      Sampler2D::sample((Sampler2D *)local_80,(float)local_48,fVar3,0.0);
      for (local_84 = 0; local_84 < 4; local_84 = local_84 + 1) {
        pfVar2 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_80,local_84);
        fVar3 = *pfVar2;
        join_0x00000010_0x00000000_ =
             (ConstStridedValueAccess<64>)
             StridedValueAccess<64>::component((StridedValueAccess<64> *)&tex,local_84);
        pfVar2 = StridedValueAccess<64>::asFloat((StridedValueAccess<64> *)&lod.m_value,local_44);
        *pfVar2 = fVar3;
      }
    }
    break;
  case TYPE_TEXTURE2D_LOD:
    iVar1 = (*this->m_lodBiasExpr->_vptr_Expression[5])();
    tex_1 = (Sampler2D *)CONCAT44(extraout_var_00,iVar1);
    _s_1 = ExecutionContext::getSampler2D(execCtx,this->m_sampler);
    for (local_b4 = 0; local_b4 < 0x40; local_b4 = local_b4 + 1) {
      _auStack_c8 = ConstStridedValueAccess<64>::component
                              ((ConstStridedValueAccess<64> *)
                               &dst.super_ConstStridedValueAccess<64>.m_value,0);
      local_b8 = ConstStridedValueAccess<64>::asFloat
                           ((ConstStridedValueAccess<64> *)auStack_c8,local_b4);
      _auStack_e0 = ConstStridedValueAccess<64>::component
                              ((ConstStridedValueAccess<64> *)
                               &dst.super_ConstStridedValueAccess<64>.m_value,1);
      local_cc = ConstStridedValueAccess<64>::asFloat
                           ((ConstStridedValueAccess<64> *)auStack_e0,local_b4);
      join_0x00000010_0x00000000_ =
           ConstStridedValueAccess<64>::component((ConstStridedValueAccess<64> *)&tex_1,0);
      fVar3 = ConstStridedValueAccess<64>::asFloat
                        ((ConstStridedValueAccess<64> *)(p_1.m_data + 2),local_b4);
      Sampler2D::sample((Sampler2D *)local_108,local_b8,local_cc,fVar3);
      for (local_10c = 0; local_10c < 4; local_10c = local_10c + 1) {
        pfVar2 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_108,local_10c);
        fVar3 = *pfVar2;
        _tex_2 = (ConstStridedValueAccess<64>)
                 StridedValueAccess<64>::component((StridedValueAccess<64> *)&tex,local_10c);
        pfVar2 = StridedValueAccess<64>::asFloat((StridedValueAccess<64> *)&tex_2,local_b4);
        *pfVar2 = fVar3;
      }
    }
    break;
  case TYPE_TEXTURE2D_PROJ:
    _s_2 = ExecutionContext::getSampler2D(execCtx,this->m_sampler);
    for (local_12c = 0; local_12c < 0x40; local_12c = local_12c + 1) {
      _auStack_140 = ConstStridedValueAccess<64>::component
                               ((ConstStridedValueAccess<64> *)
                                &dst.super_ConstStridedValueAccess<64>.m_value,0);
      local_130 = ConstStridedValueAccess<64>::asFloat
                            ((ConstStridedValueAccess<64> *)auStack_140,local_12c);
      _auStack_158 = ConstStridedValueAccess<64>::component
                               ((ConstStridedValueAccess<64> *)
                                &dst.super_ConstStridedValueAccess<64>.m_value,1);
      local_144 = ConstStridedValueAccess<64>::asFloat
                            ((ConstStridedValueAccess<64> *)auStack_158,local_12c);
      join_0x00000010_0x00000000_ =
           ConstStridedValueAccess<64>::component
                     ((ConstStridedValueAccess<64> *)&dst.super_ConstStridedValueAccess<64>.m_value,
                      2);
      fVar3 = ConstStridedValueAccess<64>::asFloat
                        ((ConstStridedValueAccess<64> *)(p_2.m_data + 2),local_12c);
      Sampler2D::sample((Sampler2D *)local_180,local_130 / fVar3,local_144 / fVar3,0.0);
      for (local_184 = 0; local_184 < 4; local_184 = local_184 + 1) {
        pfVar2 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_180,local_184);
        fVar3 = *pfVar2;
        join_0x00000010_0x00000000_ =
             (ConstStridedValueAccess<64>)
             StridedValueAccess<64>::component((StridedValueAccess<64> *)&tex,local_184);
        pfVar2 = StridedValueAccess<64>::asFloat((StridedValueAccess<64> *)&lod_1.m_value,local_12c)
        ;
        *pfVar2 = fVar3;
      }
    }
    break;
  case TYPE_TEXTURE2D_PROJ_LOD:
    iVar1 = (*this->m_lodBiasExpr->_vptr_Expression[5])();
    tex_3 = (Sampler2D *)CONCAT44(extraout_var_01,iVar1);
    _s_3 = ExecutionContext::getSampler2D(execCtx,this->m_sampler);
    for (local_1b4 = 0; local_1b4 < 0x40; local_1b4 = local_1b4 + 1) {
      _auStack_1c8 = ConstStridedValueAccess<64>::component
                               ((ConstStridedValueAccess<64> *)
                                &dst.super_ConstStridedValueAccess<64>.m_value,0);
      local_1b8 = ConstStridedValueAccess<64>::asFloat
                            ((ConstStridedValueAccess<64> *)auStack_1c8,local_1b4);
      _auStack_1e0 = ConstStridedValueAccess<64>::component
                               ((ConstStridedValueAccess<64> *)
                                &dst.super_ConstStridedValueAccess<64>.m_value,1);
      local_1cc = ConstStridedValueAccess<64>::asFloat
                            ((ConstStridedValueAccess<64> *)auStack_1e0,local_1b4);
      _auStack_1f8 = ConstStridedValueAccess<64>::component
                               ((ConstStridedValueAccess<64> *)
                                &dst.super_ConstStridedValueAccess<64>.m_value,2);
      local_1e4 = ConstStridedValueAccess<64>::asFloat
                            ((ConstStridedValueAccess<64> *)auStack_1f8,local_1b4);
      join_0x00000010_0x00000000_ =
           ConstStridedValueAccess<64>::component((ConstStridedValueAccess<64> *)&tex_3,0);
      fVar3 = ConstStridedValueAccess<64>::asFloat
                        ((ConstStridedValueAccess<64> *)(p_3.m_data + 2),local_1b4);
      Sampler2D::sample((Sampler2D *)local_220,local_1b8 / local_1e4,local_1cc / local_1e4,fVar3);
      for (local_224 = 0; local_224 < 4; local_224 = local_224 + 1) {
        pfVar2 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_220,local_224);
        fVar3 = *pfVar2;
        _tex_4 = (ConstStridedValueAccess<64>)
                 StridedValueAccess<64>::component((StridedValueAccess<64> *)&tex,local_224);
        pfVar2 = StridedValueAccess<64>::asFloat((StridedValueAccess<64> *)&tex_4,local_1b4);
        *pfVar2 = fVar3;
      }
    }
    break;
  case TYPE_TEXTURECUBE:
    _s_4 = ExecutionContext::getSamplerCube(execCtx,this->m_sampler);
    for (local_244 = 0; local_244 < 0x40; local_244 = local_244 + 1) {
      _auStack_258 = ConstStridedValueAccess<64>::component
                               ((ConstStridedValueAccess<64> *)
                                &dst.super_ConstStridedValueAccess<64>.m_value,0);
      local_248 = ConstStridedValueAccess<64>::asFloat
                            ((ConstStridedValueAccess<64> *)auStack_258,local_244);
      _auStack_270 = ConstStridedValueAccess<64>::component
                               ((ConstStridedValueAccess<64> *)
                                &dst.super_ConstStridedValueAccess<64>.m_value,1);
      local_25c = ConstStridedValueAccess<64>::asFloat
                            ((ConstStridedValueAccess<64> *)auStack_270,local_244);
      join_0x00000010_0x00000000_ =
           ConstStridedValueAccess<64>::component
                     ((ConstStridedValueAccess<64> *)&dst.super_ConstStridedValueAccess<64>.m_value,
                      2);
      fVar3 = ConstStridedValueAccess<64>::asFloat
                        ((ConstStridedValueAccess<64> *)(p_4.m_data + 2),local_244);
      SamplerCube::sample((SamplerCube *)local_298,local_248,local_25c,fVar3,0.0);
      for (local_29c = 0; local_29c < 4; local_29c = local_29c + 1) {
        pfVar2 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_298,local_29c);
        fVar3 = *pfVar2;
        join_0x00000010_0x00000000_ =
             (ConstStridedValueAccess<64>)
             StridedValueAccess<64>::component((StridedValueAccess<64> *)&tex,local_29c);
        pfVar2 = StridedValueAccess<64>::asFloat((StridedValueAccess<64> *)&lod_2.m_value,local_244)
        ;
        *pfVar2 = fVar3;
      }
    }
    break;
  case TYPE_TEXTURECUBE_LOD:
    iVar1 = (*this->m_lodBiasExpr->_vptr_Expression[5])();
    tex_5 = (SamplerCube *)CONCAT44(extraout_var_02,iVar1);
    _s_5 = ExecutionContext::getSamplerCube(execCtx,this->m_sampler);
    for (local_2cc = 0; local_2cc < 0x40; local_2cc = local_2cc + 1) {
      _auStack_2e0 = ConstStridedValueAccess<64>::component
                               ((ConstStridedValueAccess<64> *)
                                &dst.super_ConstStridedValueAccess<64>.m_value,0);
      local_2d0 = ConstStridedValueAccess<64>::asFloat
                            ((ConstStridedValueAccess<64> *)auStack_2e0,local_2cc);
      _auStack_2f8 = ConstStridedValueAccess<64>::component
                               ((ConstStridedValueAccess<64> *)
                                &dst.super_ConstStridedValueAccess<64>.m_value,1);
      local_2e4 = ConstStridedValueAccess<64>::asFloat
                            ((ConstStridedValueAccess<64> *)auStack_2f8,local_2cc);
      _auStack_310 = ConstStridedValueAccess<64>::component
                               ((ConstStridedValueAccess<64> *)
                                &dst.super_ConstStridedValueAccess<64>.m_value,2);
      local_2fc = ConstStridedValueAccess<64>::asFloat
                            ((ConstStridedValueAccess<64> *)auStack_310,local_2cc);
      join_0x00000010_0x00000000_ =
           ConstStridedValueAccess<64>::component((ConstStridedValueAccess<64> *)&tex_5,0);
      fVar3 = ConstStridedValueAccess<64>::asFloat
                        ((ConstStridedValueAccess<64> *)(p_5.m_data + 2),local_2cc);
      SamplerCube::sample((SamplerCube *)local_338,local_2d0,local_2e4,local_2fc,fVar3);
      for (local_33c = 0; local_33c < 4; local_33c = local_33c + 1) {
        pfVar2 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_338,local_33c);
        fVar3 = *pfVar2;
        local_350 = (ConstStridedValueAccess<64>)
                    StridedValueAccess<64>::component((StridedValueAccess<64> *)&tex,local_33c);
        pfVar2 = StridedValueAccess<64>::asFloat((StridedValueAccess<64> *)&local_350,local_2cc);
        *pfVar2 = fVar3;
      }
    }
  }
  return;
}

Assistant:

void TexLookup::evaluate (ExecutionContext& execCtx)
{
	// Evaluate coord and bias.
	m_coordExpr->evaluate(execCtx);
	if (m_lodBiasExpr)
		m_lodBiasExpr->evaluate(execCtx);

	ExecConstValueAccess	coords	= m_coordExpr->getValue();
	ExecValueAccess			dst		= m_value.getValue(m_valueType);

	switch (m_type)
	{
		case TYPE_TEXTURE2D:
		{
			const Sampler2D& tex = execCtx.getSampler2D(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				tcu::Vec4	p	= tex.sample(s, t, 0.0f);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		case TYPE_TEXTURE2D_LOD:
		{
			ExecConstValueAccess	lod		= m_lodBiasExpr->getValue();
			const Sampler2D&		tex		= execCtx.getSampler2D(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				float		l	= lod.component(0).asFloat(i);
				tcu::Vec4	p	= tex.sample(s, t, l);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		case TYPE_TEXTURE2D_PROJ:
		{
			const Sampler2D& tex = execCtx.getSampler2D(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				float		w	= coords.component(2).asFloat(i);
				tcu::Vec4	p	= tex.sample(s/w, t/w, 0.0f);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		case TYPE_TEXTURE2D_PROJ_LOD:
		{
			ExecConstValueAccess	lod		= m_lodBiasExpr->getValue();
			const Sampler2D&		tex		= execCtx.getSampler2D(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				float		w	= coords.component(2).asFloat(i);
				float		l	= lod.component(0).asFloat(i);
				tcu::Vec4	p	= tex.sample(s/w, t/w, l);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		case TYPE_TEXTURECUBE:
		{
			const SamplerCube& tex = execCtx.getSamplerCube(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				float		r	= coords.component(2).asFloat(i);
				tcu::Vec4	p	= tex.sample(s, t, r, 0.0f);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		case TYPE_TEXTURECUBE_LOD:
		{
			ExecConstValueAccess	lod		= m_lodBiasExpr->getValue();
			const SamplerCube&		tex		= execCtx.getSamplerCube(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				float		r	= coords.component(2).asFloat(i);
				float		l	= lod.component(0).asFloat(i);
				tcu::Vec4	p	= tex.sample(s, t, r, l);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}
}